

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

PyObject * pybind11::detail::npy_format_descriptor<sdf_tools::real3,_void>::dtype_ptr(void)

{
  short extraout_AX;
  numpy_type_info *pnVar1;
  
  if (npy_format_descriptor<sdf_tools::real3,void>::dtype_ptr()::ptr == '\0') {
    npy_format_descriptor<sdf_tools::real3,void>::dtype_ptr();
    if (extraout_AX != 0) {
      if (extraout_AX == 1) {
        load_numpy_internals(&get_numpy_internals()::ptr);
      }
      pnVar1 = numpy_internals::get_type_info
                         (get_numpy_internals()::ptr,(type_info *)&sdf_tools::real3::typeinfo,true);
      dtype_ptr::ptr = pnVar1->dtype_ptr;
      __cxa_guard_release(&npy_format_descriptor<sdf_tools::real3,void>::dtype_ptr()::ptr);
    }
  }
  return dtype_ptr::ptr;
}

Assistant:

static PyObject* dtype_ptr() {
        static PyObject* ptr = get_numpy_internals().get_type_info<T>(true)->dtype_ptr;
        return ptr;
    }